

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::ReadCustomConfigurationFileTree(cmCTest *this,string *dir,cmMakefile *mf)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference filename;
  pointer this_01;
  reference ppVar5;
  string local_e10 [32];
  undefined1 local_df0 [8];
  ostringstream cmCTestLog_msg_7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  *handler;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
  *__range2_1;
  undefined1 local_c08 [8];
  ostringstream cmCTestLog_msg_6;
  string local_a90 [32];
  undefined1 local_a70 [8];
  ostringstream cmCTestLog_msg_5;
  string *file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  Glob gl;
  undefined1 local_858 [8];
  ostringstream cmCTestLog_msg_4;
  undefined1 local_6e0 [8];
  string rexpr;
  undefined1 local_6a0 [8];
  ostringstream cmCTestLog_msg_3;
  string local_520 [7];
  bool erroroc;
  undefined1 local_500 [8];
  ostringstream cmCTestLog_msg_2;
  string local_388 [32];
  undefined1 local_368 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_1f0 [8];
  string fname;
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  bool found;
  cmMakefile *mf_local;
  string *dir_local;
  cmCTest *this_local;
  
  bVar2 = false;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"* Read custom CTest configuration directory: ");
  poVar3 = std::operator<<(poVar3,(string *)dir);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc15,pcVar4,false);
  std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
            ((string *)local_1f0,dir,(char (*) [19])"/CTestCustom.cmake");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
  poVar3 = std::operator<<((ostream *)local_368,"* Check for file: ");
  poVar3 = std::operator<<(poVar3,(string *)local_1f0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc18,pcVar4,false);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_1f0);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
    poVar3 = std::operator<<((ostream *)local_500,"* Read custom CTest configuration file: ");
    poVar3 = std::operator<<(poVar3,(string *)local_1f0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0xc1c,pcVar4,false);
    std::__cxx11::string::~string(local_520);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    cmSystemTools::ResetErrorOccurredFlag();
    bVar2 = cmMakefile::ReadListFile(mf,(string *)local_1f0);
    if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccurredFlag(), bVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a0);
      poVar3 = std::operator<<((ostream *)local_6a0,"Problem reading custom configuration: ");
      poVar3 = std::operator<<(poVar3,(string *)local_1f0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0xc23,pcVar4,false);
      std::__cxx11::string::~string((string *)(rexpr.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a0);
    }
    bVar2 = true;
    if (bVar1) {
      cmSystemTools::SetErrorOccurred();
    }
  }
  cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
            ((string *)local_6e0,dir,(char (*) [19])"/CTestCustom.ctest");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_858);
  poVar3 = std::operator<<((ostream *)local_858,"* Check for file: ");
  poVar3 = std::operator<<(poVar3,(string *)local_6e0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc2c,pcVar4,false);
  std::__cxx11::string::~string((string *)&gl.ListDirs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_858);
  if ((!bVar2) && (bVar1 = cmsys::SystemTools::FileExists((string *)local_6e0), bVar1)) {
    cmsys::Glob::Glob((Glob *)&files);
    cmsys::Glob::RecurseOn((Glob *)&files);
    cmsys::Glob::FindFiles((Glob *)&files,(string *)local_6e0,(GlobMessages *)0x0);
    this_00 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)&files);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar2) {
      filename = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a70);
      poVar3 = std::operator<<((ostream *)local_a70,"* Read custom CTest configuration file: ");
      poVar3 = std::operator<<(poVar3,(string *)filename);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0xc35,pcVar4,false);
      std::__cxx11::string::~string(local_a90);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a70);
      bVar2 = cmMakefile::ReadListFile(mf,filename);
      if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccurredFlag(), bVar2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c08);
        poVar3 = std::operator<<((ostream *)local_c08,"Problem reading custom configuration: ");
        poVar3 = std::operator<<(poVar3,(string *)filename);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0xc39,pcVar4,false);
        std::__cxx11::string::~string((string *)&__range2_1);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c08);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar2 = true;
    cmsys::Glob::~Glob((Glob *)&files);
  }
  if (bVar2) {
    this_01 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    Private::GetNamedTestingHandlers_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                *)&__begin2_1,this_01);
    __end2_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                        *)&__begin2_1);
    handler = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                        *)&__begin2_1);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&handler), bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
               ::operator*(&__end2_1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_df0);
      poVar3 = std::operator<<((ostream *)local_df0,
                               "* Read custom CTest configuration vectors for handler: ");
      poVar3 = std::operator<<(poVar3,(string *)ppVar5);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar5->second);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0xc44,pcVar4,false);
      std::__cxx11::string::~string(local_e10);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_df0);
      (**ppVar5->second->_vptr_cmCTestGenericHandler)(ppVar5->second,mf);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
      ::operator++(&__end2_1);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            *)&__begin2_1);
  }
  std::__cxx11::string::~string((string *)local_6e0);
  std::__cxx11::string::~string((string *)local_1f0);
  return 1;
}

Assistant:

int cmCTest::ReadCustomConfigurationFileTree(const std::string& dir,
                                             cmMakefile* mf)
{
  bool found = false;
  cmCTestLog(this, DEBUG,
             "* Read custom CTest configuration directory: " << dir
                                                             << std::endl);

  std::string fname = cmStrCat(dir, "/CTestCustom.cmake");
  cmCTestLog(this, DEBUG, "* Check for file: " << fname << std::endl);
  if (cmSystemTools::FileExists(fname)) {
    cmCTestLog(this, DEBUG,
               "* Read custom CTest configuration file: " << fname
                                                          << std::endl);
    bool erroroc = cmSystemTools::GetErrorOccurredFlag();
    cmSystemTools::ResetErrorOccurredFlag();

    if (!mf->ReadListFile(fname) || cmSystemTools::GetErrorOccurredFlag()) {
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem reading custom configuration: " << fname
                                                          << std::endl);
    }
    found = true;
    if (erroroc) {
      cmSystemTools::SetErrorOccurred();
    }
  }

  std::string rexpr = cmStrCat(dir, "/CTestCustom.ctest");
  cmCTestLog(this, DEBUG, "* Check for file: " << rexpr << std::endl);
  if (!found && cmSystemTools::FileExists(rexpr)) {
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.FindFiles(rexpr);
    std::vector<std::string>& files = gl.GetFiles();
    for (const std::string& file : files) {
      cmCTestLog(this, DEBUG,
                 "* Read custom CTest configuration file: " << file
                                                            << std::endl);
      if (!mf->ReadListFile(file) || cmSystemTools::GetErrorOccurredFlag()) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem reading custom configuration: " << file
                                                            << std::endl);
      }
    }
    found = true;
  }

  if (found) {
    for (auto& handler : this->Impl->GetNamedTestingHandlers()) {
      cmCTestLog(this, DEBUG,
                 "* Read custom CTest configuration vectors for handler: "
                   << handler.first << " (" << handler.second << ")"
                   << std::endl);
      handler.second->PopulateCustomVectors(mf);
    }
  }

  return 1;
}